

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderCompilationCases.cpp
# Opt level: O0

ProgramContext * __thiscall
deqp::gles2::Performance::InvalidShaderCompilerOperCase::generateShaderSources
          (ProgramContext *__return_storage_ptr__,InvalidShaderCompilerOperCase *this,
          int measurementNdx)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  ShaderValidity local_154;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  string local_b8;
  string local_98;
  string local_68;
  string local_48;
  ShaderValidity local_28;
  undefined1 local_21;
  ShaderValidity shaderValidity;
  int local_1c;
  deUint32 specID;
  int measurementNdx_local;
  InvalidShaderCompilerOperCase *this_local;
  ProgramContext *result;
  
  local_1c = measurementNdx;
  _specID = this;
  this_local = (InvalidShaderCompilerOperCase *)__return_storage_ptr__;
  shaderValidity =
       InvalidShaderCompilerCase::getSpecializationID
                 (&this->super_InvalidShaderCompilerCase,measurementNdx);
  local_21 = 0;
  InvalidShaderCompilerCase::ProgramContext::ProgramContext(__return_storage_ptr__);
  if ((this->super_InvalidShaderCompilerCase).m_invalidityType == INVALIDITY_INVALID_CHAR) {
    local_154 = SHADER_VALIDITY_INVALID_CHAR;
  }
  else {
    local_154 = SHADER_VALIDITY_LAST;
    if ((this->super_InvalidShaderCompilerCase).m_invalidityType == INVALIDITY_SEMANTIC_ERROR) {
      local_154 = SHADER_VALIDITY_SEMANTIC_ERROR;
    }
  }
  pcVar3 = (char *)(ulong)local_154;
  local_28 = local_154;
  if ((this->m_isVertexCase & 1U) == 0) {
    singleVaryingVertexTemplate_abi_cxx11_();
    pcVar3 = (char *)(ulong)local_28;
    specializeShaderSource(&local_d8,&local_f8,shaderValidity,local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_d8);
    std::__cxx11::string::~string((string *)&local_f8);
    uVar1 = this->m_numOperations;
    iVar2 = std::__cxx11::string::c_str();
    binaryOpFragmentTemplate_abi_cxx11_(&local_138,(Performance *)(ulong)uVar1,iVar2,pcVar3);
    specializeShaderSource(&local_118,&local_138,shaderValidity,local_28);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_118);
    std::__cxx11::string::~string((string *)&local_118);
    std::__cxx11::string::~string((string *)&local_138);
  }
  else {
    uVar1 = this->m_numOperations;
    iVar2 = std::__cxx11::string::c_str();
    binaryOpVertexTemplate_abi_cxx11_(&local_68,(Performance *)(ulong)uVar1,iVar2,pcVar3);
    specializeShaderSource(&local_48,&local_68,shaderValidity,local_28);
    std::__cxx11::string::operator=((string *)__return_storage_ptr__,(string *)&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::__cxx11::string::~string((string *)&local_68);
    singleVaryingFragmentTemplate_abi_cxx11_();
    specializeShaderSource(&local_98,&local_b8,shaderValidity,local_28);
    std::__cxx11::string::operator=
              ((string *)&__return_storage_ptr__->fragShaderSource,(string *)&local_98);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&local_b8);
  }
  return __return_storage_ptr__;
}

Assistant:

InvalidShaderCompilerCase::ProgramContext InvalidShaderCompilerOperCase::generateShaderSources (int measurementNdx) const
{
	deUint32		specID			= getSpecializationID(measurementNdx);
	ProgramContext	result;
	ShaderValidity	shaderValidity	= m_invalidityType == INVALIDITY_INVALID_CHAR	? SHADER_VALIDITY_INVALID_CHAR
									: m_invalidityType == INVALIDITY_SEMANTIC_ERROR	? SHADER_VALIDITY_SEMANTIC_ERROR
									: SHADER_VALIDITY_LAST;

	DE_ASSERT(shaderValidity != SHADER_VALIDITY_LAST);

	if (m_isVertexCase)
	{
		result.vertShaderSource = specializeShaderSource(binaryOpVertexTemplate(m_numOperations, m_oper.c_str()), specID, shaderValidity);
		result.fragShaderSource = specializeShaderSource(singleVaryingFragmentTemplate(), specID, shaderValidity);
	}
	else
	{
		result.vertShaderSource = specializeShaderSource(singleVaryingVertexTemplate(), specID, shaderValidity);
		result.fragShaderSource = specializeShaderSource(binaryOpFragmentTemplate(m_numOperations, m_oper.c_str()), specID, shaderValidity);
	}

	return result;
}